

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h:9762:37)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olivermichel[P]libom2_test_include_catch_h:9762:37)>
          *this,string *arg)

{
  int iVar1;
  YesOrNo YVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string mode;
  string local_d8;
  string local_b8;
  string local_98;
  undefined **local_78;
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_d8);
  local_70 = 0;
  local_78 = &PTR__BasicResult_001ae118;
  local_60 = 0;
  local_58[0] = 0;
  local_68 = local_58;
  toLower(&local_98,&local_d8);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_98);
  if (iVar1 == 0) {
    YVar2 = Yes;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_98);
    if (iVar1 == 0) {
      YVar2 = No;
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_98);
      if (iVar1 != 0) {
        ::std::operator+(&local_48,"colour mode must be one of: auto, yes or no. \'",&local_d8);
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_48);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_b8.field_2._M_allocated_capacity = *psVar4;
          local_b8.field_2._8_8_ = plVar3[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar4;
          local_b8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_b8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                  (__return_storage_ptr__,RuntimeError,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        goto LAB_0013562f;
      }
      YVar2 = Auto;
    }
  }
  ((this->m_lambda).config)->useColour = YVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001ae118;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0013562f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_78 = &PTR__BasicResult_001ae118;
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }